

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

int dbg_text(char *tgt,int min,int max,int sd)

{
  byte bVar1;
  char cVar2;
  long *plVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  byte *pbVar10;
  distribution *pdVar11;
  distribution *pdVar12;
  uint uVar13;
  byte *pbVar14;
  int iVar15;
  distribution *target;
  char *pcVar16;
  long length;
  char syntax [13];
  char syntax_1 [13];
  char sentence [257];
  char acStack_1c5 [13];
  distribution *pdStack_1b8;
  uint *puStack_1b0;
  ulong uStack_1a8;
  size_t sStack_1a0;
  distribution *pdStack_198;
  code *pcStack_190;
  uint local_17c;
  distribution local_178;
  ulong local_160;
  byte local_152 [13];
  undefined1 local_145 [277];
  
  local_178.count = 0;
  local_178.max = 0;
  pcStack_190 = (code *)0x105acd;
  local_17c = sd;
  dss_random((long *)&local_178,(long)min,(long)max,(long)sd);
  if ((long)local_178._0_8_ < 1) {
    uVar13 = 0;
LAB_00105d57:
    *tgt = '\0';
    return uVar13;
  }
  local_178.list = (set_member *)0x0;
  pdVar11 = &local_178;
LAB_00105ae0:
  pdVar12 = &grammar;
  pcVar16 = (char *)(ulong)local_17c;
  pbVar10 = local_152;
  pcStack_190 = (code *)0x105b02;
  local_178.permute = (long *)tgt;
  pick_str(&grammar,local_17c,(char *)pbVar10);
  target = (distribution *)(local_145 + 0xd);
  uVar4 = 0;
  sVar9 = 0;
LAB_00105b0c:
  plVar3 = local_178.permute;
  uVar13 = local_17c;
  iVar5 = (int)pcVar16;
  uStack_1a8 = (ulong)uVar4;
  pbVar14 = pbVar10;
  do {
    pbVar10 = pbVar14 + 1;
    bVar1 = *pbVar14;
    pbVar14 = pbVar10;
  } while (bVar1 == 0x20);
  switch(bVar1) {
  case 0x4e:
    pcVar16 = (char *)(ulong)local_17c;
    pcStack_190 = (code *)0x105b38;
    pdVar12 = target;
    uVar13 = txt_np((char *)target,local_17c);
    sVar9 = (size_t)uVar13;
    break;
  case 0x4f:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x55:
    break;
  case 0x50:
    pcStack_190 = (code *)0x105c3c;
    iVar5 = pick_str(&prepositions,local_17c,(char *)target);
    pcStack_190 = (code *)0x105c50;
    sVar9 = strlen(prepositions.list[iVar5].text);
    pdVar11 = (distribution *)(long)(int)sVar9;
    pbVar14 = (byte *)((long)&pdVar11->count + (long)&target->count);
    pdVar12 = (distribution *)(pbVar14 + 5);
    pbVar14[0] = 0x20;
    pbVar14[1] = 0x74;
    pbVar14[2] = 0x68;
    pbVar14[3] = 0x65;
    pbVar14[4] = 0x20;
    pbVar14[5] = 0;
    pcVar16 = (char *)(ulong)uVar13;
    pcStack_190 = (code *)0x105c70;
    iVar5 = txt_np((char *)pdVar12,uVar13);
    sVar9 = (size_t)((int)sVar9 + iVar5 + 5);
    break;
  case 0x54:
    target = (distribution *)((long)&target[-1].permute + 7);
    pdVar11 = &terminators;
    pcVar16 = (char *)(ulong)local_17c;
    pcStack_190 = (code *)0x105c93;
    iVar5 = pick_str(&terminators,local_17c,(char *)target);
    pdVar12 = (distribution *)terminators.list[iVar5].text;
    pcStack_190 = (code *)0x105ca7;
    sVar9 = strlen((char *)pdVar12);
    break;
  case 0x56:
    pdVar11 = (distribution *)local_145;
    pcStack_190 = (code *)0x105b6a;
    local_160 = uStack_1a8;
    pick_str(&vp,local_17c,(char *)pdVar11);
    pcVar16 = " ";
    pcStack_190 = (code *)0x105b79;
    pdVar12 = pdVar11;
    pcVar7 = strtok((char *)pdVar11," ");
    if (pcVar7 == (char *)0x0) {
      sVar9 = 0;
    }
    else {
      sVar9 = 0;
      pdVar11 = target;
      do {
        cVar2 = *pcVar7;
        if (cVar2 == 'X') {
          pdVar12 = &auxillaries;
        }
        else if (cVar2 == 'V') {
          pdVar12 = &verbs;
        }
        else if (cVar2 == 'D') {
          pdVar12 = &adverbs;
        }
        else {
          pdVar12 = (distribution *)0x0;
        }
        pcStack_190 = (code *)0x105bca;
        iVar5 = pick_str(pdVar12,local_17c,(char *)pdVar11);
        pcStack_190 = (code *)0x105bdf;
        sVar8 = strlen(pdVar12->list[iVar5].text);
        pbVar14 = (byte *)((long)&pdVar11->count + (long)(int)sVar8);
        iVar5 = (int)sVar9 + (int)sVar8;
        if (pcVar7[1] != 0) {
          iVar5 = iVar5 + 1;
          pbVar14[1] = pcVar7[1];
          pbVar14 = pbVar14 + 1;
        }
        *pbVar14 = 0x20;
        pdVar11 = (distribution *)(pbVar14 + 1);
        sVar9 = (size_t)(iVar5 + 1);
        pdVar12 = (distribution *)0x0;
        pcVar16 = " ";
        pcStack_190 = (code *)0x105c11;
        pcVar7 = strtok((char *)0x0," ");
      } while (pcVar7 != (char *)0x0);
      pdVar11 = (distribution *)0x0;
    }
    uVar4 = (uint)local_160;
    break;
  default:
    if (bVar1 == 0) goto LAB_00105cdf;
  }
  target = (distribution *)((long)&target->count + (long)(int)sVar9);
  uVar4 = (int)sVar9 + uVar4;
  if ((*pbVar10 & 0xdf) != 0) {
    uVar4 = uVar4 + 1;
    *(byte *)((long)&target->count + 1) = *pbVar10;
    target = (distribution *)((long)&target->count + 1);
  }
  goto LAB_00105b0c;
LAB_00105cdf:
  *(byte *)&target->count = 0;
  if ((int)uVar4 < 1) {
    pcStack_190 = txt_np;
    dbg_text_cold_1();
    puStack_1b0 = &switchD_00105b2a::switchdataD_00107bb8;
    pdStack_1b8 = pdVar11;
    sStack_1a0 = sVar9;
    pdStack_198 = target;
    pcStack_190 = (code *)pbVar10;
    pick_str(&np,iVar5,acStack_1c5);
    pbVar10 = (byte *)strtok(acStack_1c5," ");
    if (pbVar10 == (byte *)0x0) {
      iVar15 = 0;
    }
    else {
      iVar15 = 0;
      do {
        bVar1 = *pbVar10;
        if (bVar1 < 0x4a) {
          if (bVar1 == 0x41) {
            pdVar11 = &articles;
          }
          else {
            pdVar11 = (distribution *)0x0;
            if (bVar1 == 0x44) {
              pdVar11 = &adverbs;
            }
          }
        }
        else if (bVar1 == 0x4a) {
          pdVar11 = &adjectives;
        }
        else {
          pdVar11 = (distribution *)0x0;
          if (bVar1 == 0x4e) {
            pdVar11 = &nouns;
          }
        }
        iVar6 = pick_str(pdVar11,iVar5,(char *)pdVar12);
        sVar9 = strlen(pdVar11->list[iVar6].text);
        pbVar14 = (byte *)((long)&pdVar12->count + (long)(int)sVar9);
        iVar15 = iVar15 + (int)sVar9;
        if (pbVar10[1] != 0) {
          *pbVar14 = pbVar10[1];
          pbVar14 = pbVar14 + 1;
          iVar15 = iVar15 + 1;
        }
        *pbVar14 = 0x20;
        pdVar12 = (distribution *)(pbVar14 + 1);
        iVar15 = iVar15 + 1;
        pbVar10 = (byte *)strtok((char *)0x0," ");
      } while (pbVar10 != (byte *)0x0);
    }
    return iVar15;
  }
  uVar13 = local_178.count;
  iVar15 = (int)local_178.list;
  iVar5 = local_178.count - iVar15;
  if (iVar5 < (int)uVar4) {
    local_145[(long)iVar5 + 0xd] = 0;
    pcStack_190 = (code *)0x105d1a;
    strcpy((char *)local_178.permute,local_145 + 0xd);
    tgt = (char *)((long)plVar3 + (long)iVar5);
  }
  else {
    pcStack_190 = (code *)0x105d30;
    strcpy((char *)local_178.permute,local_145 + 0xd);
    uVar13 = iVar15 + uVar4;
    pcVar16 = (char *)((long)plVar3 + (ulong)(uVar4 - 1));
    tgt = pcVar16 + 1;
    *pcVar16 = ' ';
  }
  local_178.list = (set_member *)(ulong)uVar13;
  pdVar11 = (distribution *)local_178.list;
  if ((long)local_178._0_8_ <= (long)(int)uVar13) goto LAB_00105d57;
  goto LAB_00105ae0;
}

Assistant:

int
dbg_text(char *tgt, int min, int max, int sd)
{
	long length = 0; 
	int wordlen = 0,
		needed,
		s_len;
	char sentence[MAX_SENT_LEN + 1];
	
	RANDOM(length, min, max, sd);

	while (wordlen < length)
	{
		s_len = txt_sentence(sentence, sd);
		if ( s_len < 0)
			INTERNAL_ERROR("Bad sentence formation");
		needed = length - wordlen;
		if (needed >= s_len + 1)	/* need the entire sentence */
		{
			strcpy(tgt, sentence);
			tgt += s_len;
			wordlen += s_len + 1;
			*(tgt++) = ' ';
		}
		else /* chop the new sentence off to match the length target */
		{
			sentence[needed] = '\0';
			strcpy(tgt, sentence);
			wordlen += needed;
			tgt += needed;
		}
	}
	*tgt = '\0';

	return(wordlen);
}